

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContactAngle1.cpp
# Opt level: O0

void __thiscall
OpenMD::ContactAngle1::ContactAngle1
          (ContactAngle1 *this,SimInfo *info,string *filename,string *sele1,string *sele2,
          RealType solidZ,RealType dropletRadius)

{
  ostream *poVar1;
  SequentialAnalyzer *this_00;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  string paramString;
  stringstream params;
  string *in_stack_fffffffffffffda8;
  SequentialAnalyzer *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  string local_230 [32];
  stringstream local_210 [16];
  ostream local_200 [112];
  string *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe80;
  SimInfo *in_stack_fffffffffffffe88;
  SequentialAnalyzer *in_stack_fffffffffffffe90;
  string local_78 [32];
  string local_58 [32];
  undefined8 local_38;
  undefined8 local_30;
  
  local_38 = in_XMM1_Qa;
  local_30 = in_XMM0_Qa;
  SequentialAnalyzer::SequentialAnalyzer
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  *in_RDI = &PTR__ContactAngle1_00394ab8;
  in_RDI[0x1a9] = local_30;
  in_RDI[0x1aa] = local_38;
  getPrefix(in_stack_fffffffffffffdb8);
  std::operator+(in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
  SequentialAnalyzer::setOutputName(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::stringstream::stringstream(local_210);
  poVar1 = std::operator<<(local_200," solid Z = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)in_RDI[0x1a9]);
  this_00 = (SequentialAnalyzer *)std::operator<<(poVar1,", droplet radius = ");
  std::ostream::operator<<(this_00,(double)in_RDI[0x1aa]);
  std::__cxx11::stringstream::str();
  SequentialAnalyzer::setParameterString(this_00,in_stack_fffffffffffffda8);
  std::__cxx11::string::~string(local_230);
  std::__cxx11::stringstream::~stringstream(local_210);
  return;
}

Assistant:

ContactAngle1::ContactAngle1(SimInfo* info, const std::string& filename,
                               const std::string& sele1,
                               const std::string& sele2, RealType solidZ,
                               RealType dropletRadius) :
      SequentialAnalyzer(info, filename, sele1, sele2),
      solidZ_(solidZ), dropletRadius_(dropletRadius) {
    setOutputName(getPrefix(filename) + ".ca1");

    std::stringstream params;
    params << " solid Z = " << solidZ_
           << ", droplet radius = " << dropletRadius_;

    const std::string paramString = params.str();
    setParameterString(paramString);
  }